

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::OutputLayout::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  OutputLayout *this_local;
  
  local_18 = this;
  this_local = (OutputLayout *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 310 es                \nlayout(location = 2) out uint b;                    \nlayout(location = 3) out mediump vec2 e;            \nlayout(location = 0) out mediump vec3 a[2];         \nvoid main() {                  \n    b = 12u;                   \n    e = vec2(0, 1);            \n    a[1] = vec3(0, 1, 0);      \n    a[0] = vec3(0, 1, 0);      \n}"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 310 es                \n"
			   "layout(location = 2) out uint b;                    \n"
			   "layout(location = 3) out mediump vec2 e;            \n"
			   "layout(location = 0) out mediump vec3 a[2];         \n"
			   "void main() {                  \n"
			   "    b = 12u;                   \n"
			   "    e = vec2(0, 1);            \n"
			   "    a[1] = vec3(0, 1, 0);      \n"
			   "    a[0] = vec3(0, 1, 0);      \n"
			   "}";
	}